

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::
OnCallSpec<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
::Matches(OnCallSpec<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  DummyMatchResultListener dummy;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>>,std::tuple<unsigned_short,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                    ((tuple<testing::Matcher<unsigned_short>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    uVar2 = (**(code **)(**(long **)(this + 0x48) + 0x20))(*(long **)(this + 0x48),args);
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }